

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZElementMatrixT.cpp
# Opt level: O0

void __thiscall
TPZElementMatrixT<std::complex<double>_>::SetMatrixMinSize
          (TPZElementMatrixT<std::complex<double>_> *this,short NumBli,short NumBlj,short BlSizei,
          short BlSizej)

{
  int64_t iVar1;
  short in_CX;
  short in_DX;
  short in_SI;
  long in_RDI;
  short in_R8W;
  int64_t in_stack_00000048;
  int64_t in_stack_00000050;
  TPZFMatrix<std::complex<double>_> *in_stack_00000058;
  
  iVar1 = TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RDI + 0x1f0));
  if (((int)in_SI * (int)in_CX <= iVar1) &&
     (iVar1 = TPZBaseMatrix::Cols((TPZBaseMatrix *)(in_RDI + 0x1f0)),
     (int)in_DX * (int)in_R8W <= iVar1)) {
    return;
  }
  TPZFMatrix<std::complex<double>_>::Redim(in_stack_00000058,in_stack_00000050,in_stack_00000048);
  return;
}

Assistant:

void TPZElementMatrixT<TVar>::SetMatrixMinSize(short NumBli, short NumBlj, 
										short BlSizei, short BlSizej) {
	
	
	if(fMat.Rows() < NumBli*BlSizei || fMat.Cols() < NumBlj*BlSizej) {
		fMat.Redim(NumBli*BlSizei,NumBlj*BlSizej);
	}
}